

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int ARKodeGetLastMassFlag(void *arkode_mem,long *flag)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x8ba;
LAB_00146c30:
    arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeGetLastMassFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,msgfmt);
  }
  else {
    if (*(int *)((long)arkode_mem + 0x200) == 0) {
      *flag = 0;
    }
    else {
      lVar1 = (**(code **)((long)arkode_mem + 0x218))(arkode_mem);
      if (lVar1 == 0) {
        msgfmt = "Mass matrix solver memory is NULL.";
        iVar2 = -6;
        error_code = -6;
        line = 0x101d;
        goto LAB_00146c30;
      }
      *flag = (long)*(int *)(lVar1 + 0xe0);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ARKodeGetLastMassFlag(void* arkode_mem, long int* flag)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return ARKLS_SUCCESS for incompatible steppers */
  if (!ark_mem->step_supports_massmatrix)
  {
    *flag = ARKLS_SUCCESS;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set output and return */
  *flag = arkls_mem->last_flag;
  return (ARKLS_SUCCESS);
}